

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

int ImGui::ScaleValueFromRatioT<int,int,float>
              (ImGuiDataType data_type,float t,int v_min,int v_max,bool is_logarithmic,
              float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  bool bVar1;
  int iVar2;
  byte in_CL;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  float in_XMM0_Da;
  float fVar3;
  float fVar4;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float v_new_off_f;
  bool is_floating_point;
  float zero_point_snap_R;
  float zero_point_snap_L;
  float zero_point_center;
  float t_with_flip;
  bool flipped;
  float v_max_fudged;
  float v_min_fudged;
  int result;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_2c;
  float local_28;
  int local_24;
  float local_20;
  float local_1c;
  byte local_15;
  int local_14;
  int local_10;
  float local_c;
  int local_4;
  
  local_15 = in_CL & 1;
  local_4 = in_ESI;
  if (((0.0 < in_XMM0_Da) && (in_ESI != in_EDX)) && (local_4 = in_EDX, in_XMM0_Da < 1.0)) {
    local_24 = 0;
    if (local_15 == 0) {
      if (in_EDI == 8 || in_EDI == 9) {
        local_24 = ImLerp<int>(in_ESI,in_EDX,in_XMM0_Da);
      }
      else if (in_XMM0_Da < 1.0) {
        fVar3 = -0.5;
        if (in_ESI <= in_EDX) {
          fVar3 = 0.5;
        }
        local_24 = in_ESI + (int)((float)(in_EDX - in_ESI) * in_XMM0_Da + fVar3);
      }
    }
    else {
      local_20 = in_XMM2_Da;
      local_1c = in_XMM1_Da;
      local_14 = in_EDX;
      local_10 = in_ESI;
      local_c = in_XMM0_Da;
      fVar3 = ImAbs((float)in_ESI);
      if (local_1c <= fVar3) {
        local_50 = (float)local_10;
      }
      else {
        if (0.0 <= (float)local_10) {
          local_4c = local_1c;
        }
        else {
          local_4c = -local_1c;
        }
        local_50 = local_4c;
      }
      local_28 = local_50;
      fVar3 = ImAbs((float)local_14);
      if (local_1c <= fVar3) {
        local_58 = (float)local_14;
      }
      else {
        if (0.0 <= (float)local_14) {
          local_54 = local_1c;
        }
        else {
          local_54 = -local_1c;
        }
        local_58 = local_54;
      }
      local_2c = local_58;
      bVar1 = local_14 < local_10;
      if (bVar1) {
        ImSwap<float>(&local_28,&local_2c);
      }
      fVar3 = local_28;
      if ((((float)local_14 == 0.0) && (!NAN((float)local_14))) && ((float)local_10 < 0.0)) {
        local_2c = -local_1c;
      }
      if (bVar1) {
        local_5c = 1.0 - local_c;
      }
      else {
        local_5c = local_c;
      }
      if (0.0 <= (float)(local_10 * local_14)) {
        if (((float)local_10 < 0.0) || ((float)local_14 < 0.0)) {
          fVar3 = -local_2c;
          fVar4 = ImPow(0.0,7.525542e-39);
          fVar3 = -(fVar3 * fVar4);
        }
        else {
          fVar4 = ImPow(0.0,7.525641e-39);
          fVar3 = fVar3 * fVar4;
        }
        local_24 = (int)fVar3;
      }
      else {
        iVar2 = ImMin<int>(local_10,local_14);
        fVar3 = ImAbs((float)local_14 - (float)local_10);
        fVar3 = -(float)iVar2 / fVar3;
        if ((local_5c < fVar3 - local_20) || (fVar3 + local_20 < local_5c)) {
          if (fVar3 <= local_5c) {
            fVar3 = ImPow(0.0,7.525334e-39);
            local_1c = local_1c * fVar3;
          }
          else {
            fVar3 = ImPow(0.0,7.525201e-39);
            local_1c = -(local_1c * fVar3);
          }
          local_24 = (int)local_1c;
        }
        else {
          local_24 = 0;
        }
      }
    }
    local_4 = local_24;
  }
  return local_4;
}

Assistant:

TYPE ImGui::ScaleValueFromRatioT(ImGuiDataType data_type, float t, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    // We special-case the extents because otherwise our logarithmic fudging can lead to "mathematically correct"
    // but non-intuitive behaviors like a fully-left slider not actually reaching the minimum value. Also generally simpler.
    if (t <= 0.0f || v_min == v_max)
        return v_min;
    if (t >= 1.0f)
        return v_max;

    TYPE result = (TYPE)0;
    if (is_logarithmic)
    {
        // Fudge min/max to avoid getting silly results close to zero
        FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
        FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

        const bool flipped = v_max < v_min; // Check if range is "backwards"
        if (flipped)
            ImSwap(v_min_fudged, v_max_fudged);

        // Awkward special case - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
        if ((v_max == 0.0f) && (v_min < 0.0f))
            v_max_fudged = -logarithmic_zero_epsilon;

        float t_with_flip = flipped ? (1.0f - t) : t; // t, but flipped if necessary to account for us flipping the range

        if ((v_min * v_max) < 0.0f) // Range crosses zero, so we have to do this in two parts
        {
            float zero_point_center = (-(float)ImMin(v_min, v_max)) / ImAbs((float)v_max - (float)v_min); // The zero point in parametric space
            float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
            float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
            if (t_with_flip >= zero_point_snap_L && t_with_flip <= zero_point_snap_R)
                result = (TYPE)0.0f; // Special case to make getting exactly zero possible (the epsilon prevents it otherwise)
            else if (t_with_flip < zero_point_center)
                result = (TYPE)-(logarithmic_zero_epsilon * ImPow(-v_min_fudged / logarithmic_zero_epsilon, (FLOATTYPE)(1.0f - (t_with_flip / zero_point_snap_L))));
            else
                result = (TYPE)(logarithmic_zero_epsilon * ImPow(v_max_fudged / logarithmic_zero_epsilon, (FLOATTYPE)((t_with_flip - zero_point_snap_R) / (1.0f - zero_point_snap_R))));
        }
        else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
            result = (TYPE)-(-v_max_fudged * ImPow(-v_min_fudged / -v_max_fudged, (FLOATTYPE)(1.0f - t_with_flip)));
        else
            result = (TYPE)(v_min_fudged * ImPow(v_max_fudged / v_min_fudged, (FLOATTYPE)t_with_flip));
    }
    else
    {
        // Linear slider
        const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
        if (is_floating_point)
        {
            result = ImLerp(v_min, v_max, t);
        }
        else if (t < 1.0)
        {
            // - For integer values we want the clicking position to match the grab box so we round above
            //   This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
            // - Not doing a *1.0 multiply at the end of a range as it tends to be lossy. While absolute aiming at a large s64/u64
            //   range is going to be imprecise anyway, with this check we at least make the edge values matches expected limits.
            FLOATTYPE v_new_off_f = (SIGNEDTYPE)(v_max - v_min) * t;
            result = (TYPE)((SIGNEDTYPE)v_min + (SIGNEDTYPE)(v_new_off_f + (FLOATTYPE)(v_min > v_max ? -0.5 : 0.5)));
        }
    }

    return result;
}